

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  TokenKind TVar1;
  ExpressionSyntax *syntax_00;
  ElementSelectSyntax *syntax_01;
  ExpressionSyntax *pEVar2;
  ASTContext *context_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  SourceLocation SVar6;
  undefined4 extraout_var;
  StreamingConcatenationExpression *pSVar7;
  optional<int> value;
  StreamExpressionSyntax *pSVar8;
  Compilation *this;
  Type *pTVar9;
  Expression *pEVar10;
  Type *pTVar11;
  ValueSymbol *pVVar12;
  Diagnostic *pDVar13;
  undefined4 uVar14;
  EvalContext *context_01;
  size_t index;
  SourceRange sourceRange;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  sVar15;
  optional<slang::ConstantRange> oVar16;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  EvalContext evalCtx;
  unsigned_long local_328;
  StreamingConcatenationExpressionSyntax *local_320;
  ASTContext *local_318;
  Type *local_310;
  _Storage<unsigned_int,_true> local_304;
  char *local_300;
  ulong local_2f8;
  SourceRange local_2f0;
  Compilation *local_2e0;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *local_2d8;
  SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> local_2d0 [2];
  undefined1 local_258 [16];
  _Storage<unsigned_int,_true> local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 local_23c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_238;
  LValue **local_180;
  size_type local_178;
  size_type local_170;
  LValue *local_168 [5];
  SmallVectorBase<slang::Diagnostic> local_140;
  SourceLocation local_48;
  SourceLocation SStack_40;
  
  TVar1 = (syntax->operatorToken).kind;
  local_328 = 0;
  local_310 = assignmentTarget;
  if (((context->flags).m_bits & 0x200) == 0) {
    SVar6 = parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag(context,(DiagCode)0x290007,SVar6);
    pTVar9 = comp->errorType;
    goto LAB_003c8e16;
  }
  local_320 = syntax;
  if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
    if (TVar1 == LeftShift) {
      local_328 = 1;
    }
    goto LAB_003c8f05;
  }
  iVar4 = Expression::bind((int)syntax->sliceSize,(sockaddr *)context,4);
  pEVar10 = (Expression *)CONCAT44(extraout_var,iVar4);
  bVar3 = Expression::bad(pEVar10);
  if (!bVar3) {
    if (pEVar10->kind == DataType) {
      pTVar9 = (pEVar10->type).ptr;
      if (pTVar9 == (Type *)0x0) {
LAB_003c9542:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                  );
      }
      bVar3 = Type::isFixedSize(pTVar9);
      if (bVar3) {
        pTVar9 = (pEVar10->type).ptr;
        if (pTVar9 == (Type *)0x0) goto LAB_003c9542;
        local_328 = Type::bitstreamWidth(pTVar9);
        goto LAB_003c8ed2;
      }
      pDVar13 = ASTContext::addDiag(context,(DiagCode)0x2c0007,pEVar10->sourceRange);
      pTVar9 = (pEVar10->type).ptr;
      if (pTVar9 == (Type *)0x0) goto LAB_003c9542;
      SVar6 = (pTVar9->super_Symbol).location;
      if (((ulong)SVar6 & 0xfffffff) != 0) {
        Diagnostic::addNote(pDVar13,(DiagCode)0x40001,SVar6);
      }
    }
    else {
      value = ASTContext::evalInteger(context,pEVar10);
      bVar3 = ASTContext::requireGtZero(context,value,pEVar10->sourceRange);
      if (bVar3) {
        local_328 = (unsigned_long)
                    value.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_payload;
LAB_003c8ed2:
        syntax = local_320;
        if (TVar1 != LeftShift) {
          local_328 = 0;
          sourceRange = slang::syntax::SyntaxNode::sourceRange
                                  (&local_320->sliceSize->super_SyntaxNode);
          ASTContext::addDiag(context,(DiagCode)0x980007,sourceRange);
        }
LAB_003c8f05:
        local_2d0[0].len = 0;
        local_2d0[0].data_ = (pointer)((long)local_2d0 + 0x18);
        local_2d0[0].cap = 4;
        local_2f8 = (syntax->expressions).elements.size_ + 1;
        if (1 < local_2f8) {
          local_2d8 = &syntax->expressions;
          local_2f8 = local_2f8 >> 1;
          local_300 = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          index = 0;
          local_318 = context;
          do {
            context_00 = local_318;
            context_01 = (EvalContext *)local_258;
            pSVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::
                     operator[](local_2d8,index);
            syntax_00 = (pSVar8->expression).ptr;
            if (local_310 == (Type *)0x0) {
              if (syntax_00 == (ExpressionSyntax *)0x0) goto LAB_003c94bc;
LAB_003c8ffd:
              this = (Compilation *)
                     Expression::selfDetermined
                               (comp,syntax_00,context_00,(bitmask<slang::ast::ASTFlags>)0x200);
            }
            else {
              if (syntax_00 == (ExpressionSyntax *)0x0) {
LAB_003c94bc:
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                          );
              }
              if ((syntax_00->super_SyntaxNode).kind != StreamingConcatenationExpression)
              goto LAB_003c8ffd;
              this = (Compilation *)
                     Expression::create(comp,syntax_00,context_00,
                                        (bitmask<slang::ast::ASTFlags>)0x200,local_310);
            }
            bVar3 = Expression::bad((Expression *)this);
            if (bVar3) {
              pTVar9 = comp->errorType;
              local_258._0_8_ = (Compilation *)0x0;
              local_258._8_4_ = 0;
              local_258._12_4_ = 0;
              local_2f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
              pSVar7 = BumpAllocator::
                       emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                 (&comp->super_BumpAllocator,pTVar9,&local_328,
                                  (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                   *)local_258,&local_2f0);
              pSVar7 = (StreamingConcatenationExpression *)
                       Expression::badExpr(comp,&pSVar7->super_Expression);
              goto LAB_003c949c;
            }
            if (pSVar8->withRange != (StreamExpressionWithRangeSyntax *)0x0) {
              pTVar9 = ((not_null<const_slang::ast::Type_*> *)&(this->super_BumpAllocator).endPtr)->
                       ptr;
              if (pTVar9 == (Type *)0x0) {
LAB_003c9506:
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,local_300);
              }
              bVar3 = Type::isUnpackedArray(pTVar9);
              if (bVar3) {
                pTVar11 = pTVar9->canonical;
                if (pTVar11 == (Type *)0x0) {
                  Type::resolveCanonical(pTVar9);
                  pTVar11 = pTVar9->canonical;
                }
                if ((pTVar11->super_Symbol).kind != AssociativeArrayType) {
                  pTVar9 = Type::getArrayElementType(pTVar9);
                  bVar3 = Type::isFixedSize(pTVar9);
                  if (bVar3) {
                    syntax_01 = (pSVar8->withRange->range).ptr;
                    if (syntax_01 == (ElementSelectSyntax *)0x0) {
                      local_300 = 
                      "T slang::not_null<slang::syntax::ElementSelectSyntax *>::get() const [T = slang::syntax::ElementSelectSyntax *]"
                      ;
                      goto LAB_003c9506;
                    }
                    ASTContext::resetFlags
                              ((ASTContext *)context_01,local_318,
                               (bitmask<slang::ast::ASTFlags>)0x800000000);
                    pEVar10 = Expression::bindSelector
                                        (comp,(Expression *)this,syntax_01,(ASTContext *)context_01)
                    ;
                    bVar3 = Expression::bad(pEVar10);
                    if (!bVar3) {
                      local_258._8_4_ = local_258._8_4_ & 0xffffff00;
                      local_258._12_4_ = 0;
                      local_248._M_value = 0;
                      uStack_244._0_1_ = false;
                      uStack_244._1_3_ = 0;
                      uStack_240 = 0;
                      local_23c = 0;
                      local_238.data_ = (pointer)local_238.firstElement;
                      local_238.len = 0;
                      local_238.cap = 2;
                      local_180 = local_168;
                      local_178 = 0;
                      local_170 = 5;
                      local_140.data_ = (pointer)local_140.firstElement;
                      local_140.len = 0;
                      local_140.cap = 2;
                      local_48 = (SourceLocation)0x0;
                      SStack_40 = (SourceLocation)0x0;
                      local_258._0_8_ = comp;
                      oVar16 = Expression::evalSelector(pEVar10,context_01);
                      if (((undefined1  [12])
                           oVar16.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::ConstantRange> &
                          (undefined1  [12])0x1) == (undefined1  [12])0x0) {
                        uVar14._0_1_ = false;
                        uVar14._1_3_ = 0;
                      }
                      else {
                        iVar5 = oVar16.super__Optional_base<slang::ConstantRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                _M_payload._0_4_ -
                                oVar16.super__Optional_base<slang::ConstantRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                _M_payload._4_4_;
                        iVar4 = -iVar5;
                        if (0 < iVar5) {
                          iVar4 = iVar5;
                        }
                        local_304._M_value = iVar4 + 1;
                        uVar14._0_1_ = true;
                        uVar14._1_3_ = 0;
                      }
                      SmallVectorBase<slang::Diagnostic>::cleanup
                                (&local_140,(EVP_PKEY_CTX *)context_01);
                      if (local_180 != local_168) {
                        free(local_180);
                      }
                      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                                (&local_238,(EVP_PKEY_CTX *)context_01);
                      goto LAB_003c91d2;
                    }
                    pTVar9 = comp->errorType;
                    local_258._0_8_ = (Compilation *)0x0;
                    local_258._8_4_ = 0;
                    local_258._12_4_ = 0;
                    local_2f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
                    pSVar7 = BumpAllocator::
                             emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                       (&comp->super_BumpAllocator,pTVar9,&local_328,
                                        (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                         *)local_258,&local_2f0);
                    pSVar7 = (StreamingConcatenationExpression *)
                             Expression::badExpr(comp,&pSVar7->super_Expression);
                    goto LAB_003c949c;
                  }
                }
              }
              ASTContext::addDiag(local_318,(DiagCode)0x300007,
                                  *(SourceRange *)&(this->options).maxConstexprBacktrace);
              pTVar9 = comp->errorType;
              local_258._0_8_ = (Compilation *)0x0;
              local_258._8_4_ = 0;
              local_258._12_4_ = 0;
              local_2f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
              pSVar7 = BumpAllocator::
                       emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                 (&comp->super_BumpAllocator,pTVar9,&local_328,
                                  (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                   *)local_258,&local_2f0);
              pSVar7 = (StreamingConcatenationExpression *)
                       Expression::badExpr(comp,&pSVar7->super_Expression);
              goto LAB_003c949c;
            }
            uVar14._0_1_ = false;
            uVar14._1_3_ = 0;
            pEVar10 = (Expression *)0x0;
LAB_003c91d2:
            pEVar2 = (pSVar8->expression).ptr;
            if (pEVar2 == (ExpressionSyntax *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                        );
            }
            if ((pEVar2->super_SyntaxNode).kind != StreamingConcatenationExpression) {
              pTVar9 = ((not_null<const_slang::ast::Type_*> *)&(this->super_BumpAllocator).endPtr)->
                       ptr;
              if (pTVar9 == (Type *)0x0) {
LAB_003c9523:
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                          );
              }
              pTVar11 = pTVar9->canonical;
              if (pTVar11 == (Type *)0x0) {
                Type::resolveCanonical(pTVar9);
                pTVar11 = pTVar9->canonical;
              }
              if (((pTVar11->super_Symbol).kind == UnpackedUnionType) &&
                 (bVar3 = Type::isTaggedUnion(pTVar9), !bVar3)) {
                pTVar11 = pTVar9->canonical;
                local_2e0 = comp;
                if (pTVar11 == (Type *)0x0) {
                  Type::resolveCanonical(pTVar9);
                  pTVar11 = pTVar9->canonical;
                }
                if ((pTVar11->super_Symbol).kind != UnpackedUnionType) {
                  assert::assertFailed
                            ("T::isKind(kind)",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                             ,0xc4,
                             "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::UnpackedUnionType]"
                            );
                }
                if (*(int *)&pTVar11[1].super_Symbol.nextInScope != 0) {
                  Scope::elaborate((Scope *)(pTVar11 + 1));
                }
                comp = local_2e0;
                SVar6 = pTVar11[1].super_Symbol.location;
                if (SVar6 != (SourceLocation)0x0) {
                  pVVar12 = Symbol::as<slang::ast::ValueSymbol>((Symbol *)SVar6);
                  pTVar9 = DeclaredType::getType(&pVVar12->declaredType);
                }
              }
              bVar3 = Type::isBitstreamType(pTVar9,local_310 == (Type *)0x0);
              if (!bVar3) {
                pDVar13 = ASTContext::addDiag(local_318,(DiagCode)0x2a0007,
                                              *(SourceRange *)&(this->options).maxConstexprBacktrace
                                             );
                pTVar9 = ((not_null<const_slang::ast::Type_*> *)&(this->super_BumpAllocator).endPtr)
                         ->ptr;
                if (pTVar9 == (Type *)0x0) goto LAB_003c9523;
                ast::operator<<(pDVar13,pTVar9);
                pTVar9 = comp->errorType;
                local_258._0_8_ = (Compilation *)0x0;
                local_258._8_4_ = 0;
                local_258._12_4_ = 0;
                local_2f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
                pSVar7 = BumpAllocator::
                         emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                   (&comp->super_BumpAllocator,pTVar9,&local_328,
                                    (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                     *)local_258,&local_2f0);
                pSVar7 = (StreamingConcatenationExpression *)
                         Expression::badExpr(comp,&pSVar7->super_Expression);
                goto LAB_003c949c;
              }
            }
            local_258._8_4_ = SUB84(pEVar10,0);
            local_258._12_4_ = (undefined4)((ulong)pEVar10 >> 0x20);
            local_248 = local_304;
            local_258._0_8_ = this;
            uStack_244 = uVar14;
            SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
            emplace_back<slang::ast::StreamingConcatenationExpression::StreamExpression>
                      (local_2d0,(StreamExpression *)local_258);
            index = index + 1;
            syntax = local_320;
          } while (local_2f8 != index);
        }
        pTVar9 = comp->voidType;
        sVar15 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
                 ccopy(local_2d0,&comp->super_BumpAllocator);
        local_258._0_8_ = sVar15.data_;
        local_258._8_4_ = (undefined4)sVar15.size_;
        local_258._12_4_ = sVar15.size_._4_4_;
        local_2f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_320);
        pSVar7 = BumpAllocator::
                 emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                           (&comp->super_BumpAllocator,pTVar9,&local_328,
                            (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                             *)local_258,&local_2f0);
LAB_003c949c:
        if (local_2d0[0].data_ == (pointer)((long)local_2d0 + 0x18U)) {
          return &pSVar7->super_Expression;
        }
        free(local_2d0[0].data_);
        return &pSVar7->super_Expression;
      }
    }
  }
  pTVar9 = comp->errorType;
  syntax = local_320;
LAB_003c8e16:
  local_258._12_4_ = 0;
  local_258._8_4_ = 0;
  local_258._0_8_ = (Compilation *)0x0;
  local_2d0[0]._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pSVar7 = BumpAllocator::
           emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                     (&comp->super_BumpAllocator,pTVar9,&local_328,
                      (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                       *)local_258,(SourceRange *)local_2d0);
  pSVar7 = (StreamingConcatenationExpression *)Expression::badExpr(comp,&pSVar7->super_Expression);
  return &pSVar7->super_Expression;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context, const Type* assignmentTarget) {

    // The sole purpose of assignmentTarget here is to know whether this is a
    // "destination" stream (i.e. an unpack operation) or whether it is a source / pack.
    // Streaming concatenation is self-determined and its size/type should not be affected
    // by assignmentTarget.
    const bool isDestination = !assignmentTarget;

    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    size_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, span<const StreamExpression>(),
                                 syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->bitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<size_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        Expression* arg;
        if (assignmentTarget &&
            argSyntax->expression->kind == SyntaxKind::StreamingConcatenationExpression) {
            arg = &create(comp, *argSyntax->expression, context, ASTFlags::StreamingAllowed,
                          assignmentTarget);
        }
        else {
            arg = &selfDetermined(comp, *argSyntax->expression, context,
                                  ASTFlags::StreamingAllowed);
        }

        if (arg->bad())
            return badResult();

        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue). Interpreted as fixed-sized unpacked arrays,
            // dynamic arrays, or queues of fixed-size elements.
            auto& arrayType = *arg->type;
            if (!arrayType.isUnpackedArray() || arrayType.isAssociativeArray() ||
                !arrayType.getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg->sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, *arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            EvalContext evalCtx(comp);
            auto range = withExpr->evalSelector(evalCtx);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            const Type* type = arg->type;
            if (type->isUnpackedUnion() && !type->isTaggedUnion()) {
                auto& uu = type->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    type = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!type->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg->sourceRange) << *arg->type;
                return badResult();
            }
        }

        buffer.push_back({arg, withExpr, constantWithWidth});
    }

    // Streaming concatenation has no explicit type. Use void to prevent problems when
    // its type is passed to context-determined expressions.
    return *comp.emplace<StreamingConcatenationExpression>(comp.getVoidType(), sliceSize,
                                                           buffer.ccopy(comp),
                                                           syntax.sourceRange());
}